

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O0

bool __thiscall ON_Light::GetBBox(ON_Light *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  ON_3dPoint *points_00;
  ON_3dPoint local_2f8;
  ON_3dVector local_2e0;
  undefined1 auStack_2c8 [8];
  ON_3dVector marker;
  ON_3dVector local_298;
  ON_3dVector local_280;
  undefined1 local_268 [8];
  ON_3dPoint center;
  ON_3dPoint local_238;
  ON_3dPoint local_220;
  ON_3dPoint local_208;
  ON_3dPoint local_1f0;
  ON_3dPoint local_1d8;
  undefined1 local_1c0 [8];
  ON_BoundingBox cbox;
  ON_Plane local_178;
  undefined1 local_f8 [8];
  ON_Circle c;
  double r;
  undefined1 local_40 [8];
  ON_3dPointArray points;
  bool rc;
  bool bGrowBox_local;
  double *boxmax_local;
  double *boxmin_local;
  ON_Light *this_local;
  
  points.super_ON_SimpleArray<ON_3dPoint>.m_capacity._2_1_ = 1;
  points.super_ON_SimpleArray<ON_3dPoint>.m_capacity._3_1_ = bGrowBox;
  ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)local_40,0x10);
  switch(this->m_style) {
  case camera_directional_light:
  case world_directional_light:
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_40,&this->m_location);
    ON_3dPoint::operator+((ON_3dPoint *)&r,&this->m_location,&this->m_direction);
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_40,(ON_3dPoint *)&r);
    break;
  case camera_point_light:
  case world_point_light:
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_40,&this->m_location);
    break;
  case camera_spot_light:
  case world_spot_light:
    if ((this->m_spot_angle <= 0.0) || (90.0 < this->m_spot_angle || this->m_spot_angle == 90.0)) {
      ON_3dPoint::operator+(&local_1d8,&this->m_location,&this->m_direction);
      ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_40,&local_1d8);
    }
    else {
      dVar2 = ON_3dVector::Length(&this->m_direction);
      dVar1 = tan((this->m_spot_angle * 3.141592653589793) / 180.0);
      c.radius = dVar2 * dVar1;
      ON_3dPoint::operator+((ON_3dPoint *)&cbox.m_max.z,&this->m_location,&this->m_direction);
      ON_Plane::ON_Plane(&local_178,(ON_3dPoint *)&cbox.m_max.z,&this->m_direction);
      ON_Circle::ON_Circle((ON_Circle *)local_f8,&local_178,c.radius);
      ON_Plane::~ON_Plane(&local_178);
      ON_Circle::BoundingBox((ON_BoundingBox *)local_1c0,(ON_Circle *)local_f8);
      ON_BoundingBox::GetCorners((ON_BoundingBox *)local_1c0,(ON_3dPointArray *)local_40);
      ON_Circle::~ON_Circle((ON_Circle *)local_f8);
    }
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_40,&this->m_location);
    break;
  case ambient_light:
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_40,&this->m_location);
    points.super_ON_SimpleArray<ON_3dPoint>.m_capacity._2_1_ = 0;
    break;
  case world_linear_light:
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_40,&this->m_location);
    ON_3dPoint::operator+(&local_1f0,&this->m_location,&this->m_length);
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_40,&local_1f0);
    break;
  case world_rectangular_light:
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_40,&this->m_location);
    ON_3dPoint::operator+(&local_208,&this->m_location,&this->m_length);
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_40,&local_208);
    ON_3dPoint::operator+(&local_220,&this->m_location,&this->m_width);
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_40,&local_220);
    ON_3dPoint::operator+((ON_3dPoint *)&center.z,&this->m_location,&this->m_width);
    ON_3dPoint::operator+(&local_238,(ON_3dPoint *)&center.z,&this->m_length);
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_40,&local_238);
    ON_3dVector::operator+(&local_298,&this->m_width,&this->m_length);
    ON_3dVector::operator*(&local_280,&local_298,0.5);
    ON_3dPoint::operator+((ON_3dPoint *)local_268,&this->m_location,&local_280);
    ON_3dPoint::operator+((ON_3dPoint *)&marker.z,(ON_3dPoint *)local_268,&this->m_direction);
    ON_SimpleArray<ON_3dPoint>::Append
              ((ON_SimpleArray<ON_3dPoint> *)local_40,(ON_3dPoint *)&marker.z);
    marker.y = (this->m_direction).z;
    auStack_2c8 = (undefined1  [8])(this->m_direction).x;
    marker.x = (this->m_direction).y;
    ON_3dVector::Unitize((ON_3dVector *)auStack_2c8);
    ON_3dVector::operator+(&local_2e0,&this->m_width,&this->m_length);
    dVar2 = ON_3dVector::Length(&local_2e0);
    ON_3dVector::operator*=((ON_3dVector *)auStack_2c8,dVar2 / 12.0);
    ON_3dPoint::operator+(&local_2f8,(ON_3dPoint *)local_268,(ON_3dVector *)auStack_2c8);
    ON_SimpleArray<ON_3dPoint>::Append((ON_SimpleArray<ON_3dPoint> *)local_40,&local_2f8);
    break;
  default:
    points.super_ON_SimpleArray<ON_3dPoint>.m_capacity._2_1_ = 0;
  }
  if (((points.super_ON_SimpleArray<ON_3dPoint>.m_capacity._2_1_ & 1) != 0) &&
     (iVar5 = ON_SimpleArray<ON_3dPoint>::Count((ON_SimpleArray<ON_3dPoint> *)local_40), 0 < iVar5))
  {
    iVar5 = ON_SimpleArray<ON_3dPoint>::Count((ON_SimpleArray<ON_3dPoint> *)local_40);
    points_00 = ON_SimpleArray<ON_3dPoint>::Array((ON_SimpleArray<ON_3dPoint> *)local_40);
    bVar4 = ON_GetPointListBoundingBox
                      (3,false,iVar5,3,&points_00->x,boxmin,boxmax,
                       points.super_ON_SimpleArray<ON_3dPoint>.m_capacity._3_1_ & 1);
    points.super_ON_SimpleArray<ON_3dPoint>.m_capacity._2_1_ = -bVar4 & 1;
  }
  bVar3 = points.super_ON_SimpleArray<ON_3dPoint>.m_capacity._2_1_;
  ON_3dPointArray::~ON_3dPointArray((ON_3dPointArray *)local_40);
  return (bool)(bVar3 & 1);
}

Assistant:

bool ON_Light::GetBBox( // returns true if successful
       double* boxmin,    // boxmin[dim]
       double* boxmax,    // boxmax[dim]
       bool bGrowBox
       ) const
{
  bool rc = true;
  ON_3dPointArray points(16);

  switch(m_style)
  {
  case ON::camera_directional_light:
  case ON::world_directional_light:
    points.Append(m_location);
    points.Append(m_location+m_direction);
    break;

  case ON::camera_point_light:
  case ON::world_point_light:
    points.Append(m_location);
    break;

  case ON::camera_spot_light:
  case ON::world_spot_light:
    if ( m_spot_angle > 0.0 && m_spot_angle < 90.0 )
    {
      double r = m_direction.Length()*tan(ON_PI*m_spot_angle/180.0);
      ON_Circle c(ON_Plane(m_location+m_direction,m_direction),r);
      ON_BoundingBox cbox = c.BoundingBox();
      cbox.GetCorners( points );
    }
    else
    {
      points.Append(m_location+m_direction);
    }
    points.Append(m_location);
    break;

  case ON::ambient_light:
    points.Append(m_location);
    rc = false;
    break;
  
  case ON::world_linear_light:
    points.Append(m_location);
    points.Append(m_location+m_length);
    break;

  case ON::world_rectangular_light:
    points.Append(m_location);
    points.Append(m_location+m_length);
    points.Append(m_location+m_width);
    points.Append(m_location+m_width+m_length);
    {
      // include target and direction marker to avoid display clipping
      ON_3dPoint center(m_location+(m_width+m_length)*0.5);
      points.Append(center+m_direction);
      ON_3dVector marker(m_direction); 
      marker.Unitize();
      marker *= (m_width+m_length).Length()/12.0; // from GetRectangularLightSegments
      points.Append(center+marker);
    }
    break;

  default:
    rc = false;
    break;
  }

  if ( rc && points.Count() > 0 )
  {
     rc = ON_GetPointListBoundingBox( 3, 0, points.Count(), 3, 
                                      (double*)points.Array(), 
                                      boxmin, boxmax, 
                                      bGrowBox?true:false )
        ? true 
        : false;
  }

  return rc;
}